

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O1

void __thiscall glslang::TPpContext::missingEndifCheck(TPpContext *this)

{
  TParseContextBase *pTVar1;
  TInputScanner *pTVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar3;
  uint uVar4;
  TSourceLoc *pTVar5;
  
  if (0 < this->ifdepth) {
    pTVar1 = this->parseContext;
    pTVar2 = (pTVar1->super_TParseVersions).currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar5 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar4 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar4) {
        uVar4 = pTVar2->currentSource;
      }
      uVar3 = 0;
      if (0 < (int)uVar4) {
        uVar3 = uVar4;
      }
      pTVar5 = pTVar2->loc + uVar3;
    }
    UNRECOVERED_JUMPTABLE = (pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2f];
    (*UNRECOVERED_JUMPTABLE)(pTVar1,pTVar5,"missing #endif","","",UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void TPpContext::missingEndifCheck()
{
    if (ifdepth > 0)
        parseContext.ppError(parseContext.getCurrentLoc(), "missing #endif", "", "");
}